

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O2

ValueType * __thiscall
huelang::WordValue::getType(ValueType *__return_storage_ptr__,WordValue *this,Environment *env)

{
  Word WVar1;
  DefinitionTable table;
  allocator<char> aStack_18039;
  string sStack_18038;
  DefinitionTable DStack_18018;
  
  DefinitionTable::DefinitionTable(&DStack_18018,&env->definitionTable);
  std::__cxx11::string::string<std::allocator<char>>((string *)&sStack_18038,"word",&aStack_18039);
  WVar1 = DefinitionTable::TokToWord(&DStack_18018,&sStack_18038);
  std::__cxx11::string::~string((string *)&sStack_18038);
  __return_storage_ptr__->compound =
       (vector<huelang::ValueType,_std::allocator<huelang::ValueType>_> *)0x0;
  (__return_storage_ptr__->atom).major = WVar1.major;
  (__return_storage_ptr__->atom).minor = WVar1.minor;
  __return_storage_ptr__->isCompound = false;
  DefinitionTable::~DefinitionTable(&DStack_18018);
  return __return_storage_ptr__;
}

Assistant:

ValueType WordValue::getType(Environment& env) {
        DefinitionTable table = env.definitionTable;
        Word wordword = table.TokToWord(WORDWORD);
        return ValueType{NULL, wordword, false};
    }